

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

uint64_t __thiscall
CaptureSummary::GetCountByNumber(CaptureSummary *this,char *table_name,uint32_t number)

{
  int iVar1;
  size_type sVar2;
  reference pp_Var3;
  ulong local_30;
  size_t i;
  uint64_t count;
  uint32_t number_local;
  char *table_name_local;
  CaptureSummary *this_local;
  
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::size(&this->summary);
    if (sVar2 <= local_30) {
      return 0;
    }
    pp_Var3 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                        (&this->summary,local_30);
    iVar1 = compare_string(table_name,(*pp_Var3)->registry_name);
    if (((iVar1 == 0) &&
        (pp_Var3 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                             (&this->summary,local_30), (*pp_Var3)->key_type == 0)) &&
       (pp_Var3 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                            (&this->summary,local_30), ((*pp_Var3)->field_2).key_number == number))
    break;
    local_30 = local_30 + 1;
  }
  pp_Var3 = std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::operator[]
                      (&this->summary,local_30);
  return (*pp_Var3)->count;
}

Assistant:

uint64_t CaptureSummary::GetCountByNumber(char const * table_name, uint32_t number)
{
    uint64_t count = 0;

    for (size_t i = 0; i < summary.size(); i++)
    {
        if (compare_string(table_name, summary[i]->registry_name) == 0 &&
            summary[i]->key_type == 0 &&
            summary[i]->key_number == (int)number)
        {
            count = summary[i]->count;
            break;
        }
    }

    return count;
}